

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinGE<5,_0,_0>::propagate(BinGE<5,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int64_t m_v;
  long lVar7;
  int64_t m_v_1;
  long lVar8;
  TrailElem local_38;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  iVar4 = (pIVar1->min).v;
  lVar8 = (long)(this->x).b;
  lVar7 = (long)(pIVar2->min).v;
  if (lVar8 - (pIVar1->max).v < lVar7) {
    if (so.lazy) {
      iVar3 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])();
      lVar5 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar5 = 0;
    }
    pIVar1 = (this->x).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar1,(this->x).b - lVar7,lVar5,1);
    if ((char)iVar3 != '\0') goto LAB_001b6cd3;
LAB_001b6d6c:
    bVar6 = false;
  }
  else {
LAB_001b6cd3:
    lVar8 = lVar8 - iVar4;
    if (lVar8 < (((this->y).var)->max).v) {
      if (so.lazy == true) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        lVar7 = (long)iVar4 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->y).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar8,lVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001b6d6c;
    }
    bVar6 = true;
    if ((long)(((this->y).var)->max).v <= (long)(this->x).b - (long)(((this->x).var)->max).v) {
      local_38.pt = (int *)&(this->super_Propagator).satisfied;
      local_38.x = (int)(this->super_Propagator).satisfied.v;
      local_38.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_38);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  return bVar6;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}